

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O2

double __thiscall
chrono::curiosity::Curiosity::GetWheelTracTorque(Curiosity *this,CuriosityWheelID id)

{
  int iVar1;
  double dVar2;
  
  iVar1 = (*((this->m_driver).
             super___shared_ptr<chrono::curiosity::CuriosityDriver,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_CuriosityDriver[2])();
  if (iVar1 == 1) {
    return 0.0;
  }
  dVar2 = (double)(**(code **)(*(long *)(this->m_drive_motors)._M_elems[id].
                                        super___shared_ptr<chrono::ChLinkMotorRotation,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + 0x280))();
  return dVar2;
}

Assistant:

double Curiosity::GetWheelTracTorque(CuriosityWheelID id) const {
    if (m_driver->GetDriveMotorType() == CuriosityDriver::DriveMotorType::TORQUE)
        return 0;

    return m_drive_motors[id]->GetMotorTorque();
}